

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O3

REF_STATUS
ref_facelift_inverse_eval
          (REF_FACELIFT ref_facelift,REF_INT type,REF_INT id,REF_DBL *xyz,REF_DBL *param)

{
  REF_GEOM ref_geom;
  uint uVar1;
  uint uVar2;
  REF_DBL displacement [3];
  double local_68;
  double dStack_60;
  double local_58;
  undefined1 local_48 [16];
  REF_DBL local_38;
  
  ref_geom = ref_facelift->grid->geom;
  local_48._0_8_ = *xyz;
  local_48._8_8_ = xyz[1];
  local_38 = xyz[2];
  uVar1 = ref_egads_inverse_eval(ref_geom,type,id,(REF_DBL *)local_48,param);
  if (uVar1 == 0) {
    uVar1 = 0;
    if (ref_facelift->displacement != (REF_DBL *)0x0) {
      uVar1 = ref_facelift_displacement_at(ref_facelift,type,id,param,&local_68);
      if (uVar1 == 0) {
        dStack_60 = (double)local_48._8_8_ - dStack_60;
        local_48._8_4_ = SUB84(dStack_60,0);
        local_48._0_8_ = (double)local_48._0_8_ - local_68;
        local_48._12_4_ = (int)((ulong)dStack_60 >> 0x20);
        local_38 = local_38 - local_58;
        uVar2 = ref_egads_inverse_eval(ref_geom,type,id,(REF_DBL *)local_48,param);
        uVar1 = 0;
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x306,"ref_facelift_inverse_eval",(ulong)uVar2,"inv eval before");
          uVar1 = uVar2;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x300,"ref_facelift_inverse_eval",(ulong)uVar1,"facelift displacement");
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x2fa,"ref_facelift_inverse_eval",(ulong)uVar1,"inv eval before");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_inverse_eval(REF_FACELIFT ref_facelift,
                                             REF_INT type, REF_INT id,
                                             REF_DBL *xyz, REF_DBL *param) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_DBL geom_xyz[3];
  REF_DBL displacement[3];

  geom_xyz[0] = xyz[0];
  geom_xyz[1] = xyz[1];
  geom_xyz[2] = xyz[2];
  RSS(ref_egads_inverse_eval(ref_geom, type, id, geom_xyz, param),
      "inv eval before");

  if (ref_facelift_direct(ref_facelift)) {
  } else {
    RSS(ref_facelift_displacement_at(ref_facelift, type, id, param,
                                     displacement),
        "facelift displacement");

    geom_xyz[0] -= displacement[0];
    geom_xyz[1] -= displacement[1];
    geom_xyz[2] -= displacement[2];
    RSS(ref_egads_inverse_eval(ref_geom, type, id, geom_xyz, param),
        "inv eval before");
  }

  return REF_SUCCESS;
}